

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O0

void __thiscall SGParser::Generator::RegExprDFAParseElement::Destroy(RegExprDFAParseElement *this)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  RegExprDFANode *this_01;
  RegExprDFAParseElement *this_local;
  
  if (this->DataType == Chars) {
    this_00 = (this->field_1).pChars;
    if (this_00 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(this_00);
      operator_delete(this_00,0x18);
    }
  }
  else if ((this->DataType == Node) &&
          (this_01 = (this->field_1).pNode, this_01 != (RegExprDFANode *)0x0)) {
    RegExprDFANode::~RegExprDFANode(this_01);
    operator_delete(this_01,0x80);
  }
  this->DataType = Null;
  return;
}

Assistant:

void Destroy() {
        switch (DataType) {
            case RegExprDataType::Chars: delete pChars; break;
            case RegExprDataType::Node:  delete pNode;  break;
            default:                                    break;
        }
        DataType = RegExprDataType::Null;
    }